

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirCommand.cxx
# Opt level: O1

bool __thiscall
cmSubdirCommand::InitialPass
          (cmSubdirCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  undefined8 in_RAX;
  char *pcVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  ulong *puVar10;
  ulong uVar11;
  undefined8 uVar12;
  bool excludeFromAll;
  pointer inName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string binPath;
  string srcPath;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  string local_b8;
  allocator local_95;
  undefined4 local_94;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  inName = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (inName == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    bVar4 = 0;
  }
  else if (inName == (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = 1;
  }
  else {
    paVar1 = &local_b8.field_2;
    local_94 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    excludeFromAll = false;
    do {
      iVar5 = std::__cxx11::string::compare((char *)inName);
      if (iVar5 == 0) {
        excludeFromAll = true;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)inName);
        if (iVar5 != 0) {
          pcVar6 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
          std::__cxx11::string::string((string *)&local_d8,pcVar6,(allocator *)local_70);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_b8.field_2._M_allocated_capacity = *psVar9;
            local_b8.field_2._8_8_ = plVar7[3];
            local_b8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_b8.field_2._M_allocated_capacity = *psVar9;
            local_b8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_b8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_b8,(ulong)(inName->_M_dataplus)._M_p);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_90.field_2._M_allocated_capacity = *psVar9;
            local_90.field_2._8_8_ = plVar7[3];
          }
          else {
            local_90.field_2._M_allocated_capacity = *psVar9;
            local_90._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_90._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          bVar3 = cmsys::SystemTools::FileIsDirectory(&local_90);
          if (bVar3) {
            pcVar6 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
            std::__cxx11::string::string((string *)local_70,pcVar6,(allocator *)&local_50);
            plVar7 = (long *)std::__cxx11::string::append((char *)local_70);
            local_d8 = &local_c8;
            puVar10 = (ulong *)(plVar7 + 2);
            if ((ulong *)*plVar7 == puVar10) {
              local_c8 = *puVar10;
              lStack_c0 = plVar7[3];
            }
            else {
              local_c8 = *puVar10;
              local_d8 = (ulong *)*plVar7;
            }
            local_d0 = plVar7[1];
            *plVar7 = (long)puVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_d8,(ulong)(inName->_M_dataplus)._M_p);
            psVar9 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_b8.field_2._M_allocated_capacity = *psVar9;
              local_b8.field_2._8_8_ = puVar8[3];
              local_b8._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_b8.field_2._M_allocated_capacity = *psVar9;
              local_b8._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_b8._M_string_length = puVar8[1];
            *puVar8 = psVar9;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            if (local_d8 != &local_c8) {
              operator_delete(local_d8,local_c8 + 1);
            }
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
            cmMakefile::AddSubDirectory
                      ((this->super_cmCommand).Makefile,&local_90,&local_b8,excludeFromAll,false);
LAB_00342cc3:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar1) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar3 = cmsys::SystemTools::FileIsDirectory(inName);
            if (bVar3) {
              pcVar6 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
              std::__cxx11::string::string((string *)local_70,pcVar6,&local_95);
              plVar7 = (long *)std::__cxx11::string::append((char *)local_70);
              local_d8 = &local_c8;
              puVar10 = (ulong *)(plVar7 + 2);
              if ((ulong *)*plVar7 == puVar10) {
                local_c8 = *puVar10;
                lStack_c0 = plVar7[3];
              }
              else {
                local_c8 = *puVar10;
                local_d8 = (ulong *)*plVar7;
              }
              local_d0 = plVar7[1];
              *plVar7 = (long)puVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              cmsys::SystemTools::GetFilenameName(&local_50,inName);
              uVar11 = 0xf;
              if (local_d8 != &local_c8) {
                uVar11 = local_c8;
              }
              if (uVar11 < local_50._M_string_length + local_d0) {
                uVar12 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  uVar12 = local_50.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar12 < local_50._M_string_length + local_d0) goto LAB_00342be4;
                puVar8 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_50,0,(char *)0x0,(ulong)local_d8);
              }
              else {
LAB_00342be4:
                puVar8 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_d8,(ulong)local_50._M_dataplus._M_p);
              }
              psVar9 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_b8.field_2._M_allocated_capacity = *psVar9;
                local_b8.field_2._8_8_ = puVar8[3];
                local_b8._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_b8.field_2._M_allocated_capacity = *psVar9;
                local_b8._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_b8._M_string_length = puVar8[1];
              *puVar8 = psVar9;
              puVar8[1] = 0;
              *(undefined1 *)psVar9 = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_d8 != &local_c8) {
                operator_delete(local_d8,local_c8 + 1);
              }
              if (local_70[0] != local_60) {
                operator_delete(local_70[0],local_60[0] + 1);
              }
              cmMakefile::AddSubDirectory
                        ((this->super_cmCommand).Makefile,inName,&local_b8,excludeFromAll,false);
              goto LAB_00342cc3;
            }
            local_b8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"Incorrect SUBDIRS command. Directory: ","");
            local_d8 = &local_c8;
            pcVar2 = (inName->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,pcVar2,pcVar2 + inName->_M_string_length);
            std::__cxx11::string::append((char *)&local_d8);
            std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8);
            if (local_d8 != &local_c8) {
              operator_delete(local_d8,local_c8 + 1);
            }
            cmCommand::SetError(&this->super_cmCommand,&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar1) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            local_94 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
      }
      inName = inName + 1;
    } while (inName != (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    bVar4 = (byte)local_94;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool cmSubdirCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  bool res = true;
  bool excludeFromAll = false;

  for (std::vector<std::string>::const_iterator i = args.begin();
       i != args.end(); ++i) {
    if (*i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (*i == "PREORDER") {
      // Ignored
      continue;
    }

    // if they specified a relative path then compute the full
    std::string srcPath =
      std::string(this->Makefile->GetCurrentSourceDirectory()) + "/" + *i;
    if (cmSystemTools::FileIsDirectory(srcPath)) {
      std::string binPath =
        std::string(this->Makefile->GetCurrentBinaryDirectory()) + "/" + *i;
      this->Makefile->AddSubDirectory(srcPath, binPath, excludeFromAll, false);
    }
    // otherwise it is a full path
    else if (cmSystemTools::FileIsDirectory(*i)) {
      // we must compute the binPath from the srcPath, we just take the last
      // element from the source path and use that
      std::string binPath =
        std::string(this->Makefile->GetCurrentBinaryDirectory()) + "/" +
        cmSystemTools::GetFilenameName(*i);
      this->Makefile->AddSubDirectory(*i, binPath, excludeFromAll, false);
    } else {
      std::string error = "Incorrect SUBDIRS command. Directory: ";
      error += *i + " does not exist.";
      this->SetError(error);
      res = false;
    }
  }
  return res;
}